

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScenePrivate::processDirtyItemsRecursive
          (QGraphicsScenePrivate *this,QGraphicsItem *item,bool dirtyAncestorContainsChildren,
          qreal parentOpacity)

{
  undefined1 *puVar1;
  int *piVar2;
  QGraphicsScene *this_00;
  long lVar3;
  QGraphicsView **ppQVar4;
  QGraphicsViewPrivate *this_01;
  QGraphicsView *this_02;
  ulong uVar5;
  QGraphicsItem **ppQVar6;
  QGraphicsItem *pQVar7;
  QGraphicsEffect *pQVar8;
  double dVar9;
  byte bVar10;
  bool bVar11;
  uint uVar12;
  qint64 qVar13;
  qint64 qVar14;
  QGraphicsItemPrivate *pQVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  QRectF *pQVar20;
  qreal *pqVar21;
  QTransform *pQVar22;
  QRect *r;
  undefined8 uVar23;
  QRect *r_00;
  long lVar24;
  long in_FS_OFFSET;
  bool bVar25;
  bool bVar26;
  byte bVar27;
  ulong uVar28;
  qreal parentOpacity_00;
  double dVar29;
  qreal qVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  QRectF boundingRect;
  QTransform xform;
  ulong local_168;
  QRectF local_128;
  QRectF local_108;
  QRect local_e8;
  QTransform local_d8;
  QRectF local_88 [2];
  long local_38;
  
  bVar27 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar15 = (item->d_ptr).d;
  uVar17 = *(ulong *)&pQVar15->field_0x160;
  if ((uVar17 & 0x6000000) == 0) {
LAB_005fe0d3:
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffefffffffffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffbfffffffffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfffffffffbffffff;
    pQVar15 = (item->d_ptr).d;
    (pQVar15->needsRepaint).w = 0.0;
    (pQVar15->needsRepaint).h = 0.0;
    (pQVar15->needsRepaint).xp = 0.0;
    (pQVar15->needsRepaint).yp = 0.0;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffffbfffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffff7fffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfdffffffffffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfbffffffffffffff;
    pQVar15 = (item->d_ptr).d;
    if ((long)*(ulong *)&pQVar15->field_0x160 < 0) {
      *(ulong *)&pQVar15->field_0x160 = *(ulong *)&pQVar15->field_0x160 & 0x7fffffffffffffff;
      pQVar15 = (item->d_ptr).d;
      uVar12 = *(uint *)&pQVar15->field_0x168;
      uVar23 = 4;
      if ((uVar12 & 1) != 0) {
        uVar23 = 0xc;
        goto LAB_005fe1c3;
      }
LAB_005fe1cc:
      pQVar8 = pQVar15->graphicsEffect;
      if (pQVar8 != (QGraphicsEffect *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          (**(code **)(*(long *)pQVar8 + 0x70))(pQVar8,uVar23);
          return;
        }
        goto LAB_005fef87;
      }
    }
    else {
      uVar12 = *(uint *)&pQVar15->field_0x168;
      if ((uVar12 & 1) != 0) {
        uVar23 = 8;
LAB_005fe1c3:
        *(uint *)&pQVar15->field_0x168 = uVar12 & 0xfffffffe;
        pQVar15 = (item->d_ptr).d;
        goto LAB_005fe1cc;
      }
    }
  }
  else {
    if ((uVar17 & 0x200000000000020) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        bVar26 = true;
        goto LAB_005fdf82;
      }
      goto LAB_005fef87;
    }
    this_00 = *(QGraphicsScene **)&this->field_0x8;
    lVar3 = (pQVar15->children).d.size;
    bVar26 = true;
    if ((uVar17 >> 0x2a & 1) != 0) {
      if (lVar3 == 0) {
        *(ulong *)&pQVar15->field_0x160 = uVar17 & 0xfffffffffdffffff;
        goto LAB_005fe0d3;
      }
      bVar26 = pQVar15->graphicsEffect != (QGraphicsEffect *)0x0;
    }
    if ((((uint)(uVar17 >> 0x26) & 1) == 0 && pQVar15->parent != (QGraphicsItem *)0x0) &&
       ((((pQVar15->parent->d_ptr).d)->field_0x164 & 0x80) == 0)) {
      parentOpacity_00 = parentOpacity * pQVar15->opacity;
    }
    else {
      parentOpacity_00 = pQVar15->opacity;
    }
    bVar25 = (uVar17 >> 0x3a & 1) == 0;
    if (parentOpacity_00 < 0.001 && bVar25) {
      if (lVar3 != 0) {
        if ((uVar17 >> 0x27 & 1) != 0) goto LAB_005fdf98;
        lVar18 = 0;
        do {
          if ((*(ulong *)&(((pQVar15->children).d.ptr[lVar18]->d_ptr).d)->field_0x160 & 0x4000000000
              ) != 0) goto LAB_005fdf98;
          lVar18 = lVar18 + 1;
        } while (lVar3 != lVar18);
      }
      bVar26 = lVar3 != 0;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_005fdf82:
        resetDirtyItem(this,item,bVar26);
        return;
      }
      goto LAB_005fef87;
    }
LAB_005fdf98:
    local_168 = uVar17;
    if ((uVar17 & 0x20002000040000) == 0x20000000000000) {
      (*pQVar15->_vptr_QGraphicsItemPrivate[2])();
      pQVar15 = (item->d_ptr).d;
      local_168 = *(ulong *)&pQVar15->field_0x160;
    }
    if ((bool)((parentOpacity_00 < 0.001 && bVar25) | bVar26 ^ 1U) || dirtyAncestorContainsChildren)
    {
      *(ulong *)&pQVar15->field_0x160 = local_168 & 0xfffffffffdffffff;
      puVar1 = &((item->d_ptr).d)->field_0x160;
      *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffff7fffffff;
      if (parentOpacity_00 < 0.001 && bVar25 || (bool)(bVar26 ^ 1U)) {
        puVar1 = &((item->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffefffffffffffff;
      }
    }
    if (((this->field_0xb8 & 1) == 0) &&
       (uVar28 = *(ulong *)&((item->d_ptr).d)->field_0x160, (~uVar28 & 0x40000000000020) == 0)) {
      if ((uVar28 >> 0x3e & 1) == 0) {
        (*item->_vptr_QGraphicsItem[3])(&local_108,item);
        QTransform::mapRect((QRectF *)&local_d8);
      }
      else {
        (*item->_vptr_QGraphicsItem[3])(&local_108,item);
        pQVar15 = (item->d_ptr).d;
        local_d8.m_matrix[0][0] = (pQVar15->sceneTransform).m_matrix[2][0] + local_108.xp;
        local_d8.m_matrix[0][1] = (pQVar15->sceneTransform).m_matrix[2][1] + local_108.yp;
        local_d8.m_matrix[0][2] = local_108.w;
        local_d8.m_matrix[1][0] = local_108.h;
      }
      QRectF::operator|(local_88,&this->growingItemsBoundingRect);
      (this->growingItemsBoundingRect).w = local_88[0].w;
      (this->growingItemsBoundingRect).h = local_88[0].h;
      (this->growingItemsBoundingRect).xp = local_88[0].xp;
      (this->growingItemsBoundingRect).yp = local_88[0].yp;
    }
    pQVar15 = (item->d_ptr).d;
    if ((*(ulong *)&pQVar15->field_0x160 & 0x10000002000000) != 0) {
      if ((this->views).d.size == 0) {
        local_108.w = -NAN;
        local_108.h = -NAN;
        local_108.xp = -NAN;
        local_108.yp = -NAN;
        QGraphicsItemPrivate::effectiveBoundingRect(&local_108,pQVar15,(QGraphicsItem *)0x0);
        if ((local_108.w == 0.0) && (!NAN(local_108.w))) {
          local_108.xp = local_108.xp + -1e-05;
          local_108.yp = local_108.yp + 0.0;
          local_108.w = local_108.w + 2e-05;
          local_108.h = local_108.h + 0.0;
        }
        if ((local_108.h == 0.0) && (!NAN(local_108.h))) {
          local_108.xp = local_108.xp + 0.0;
          local_108.yp = local_108.yp + -1e-05;
          local_108.h = local_108.h + 2e-05;
        }
        if ((uVar17 & 0x2000040000) == 0) goto LAB_005fe494;
      }
      else {
        bVar10 = QObjectPrivate::isSignalConnected((uint)this,SUB41(this->changedSignalIndex,0));
        local_108.w = -NAN;
        local_108.h = -NAN;
        local_108.xp = -NAN;
        local_108.yp = -NAN;
        QGraphicsItemPrivate::effectiveBoundingRect(&local_108,(item->d_ptr).d,(QGraphicsItem *)0x0)
        ;
        if ((local_108.w == 0.0) && (!NAN(local_108.w))) {
          local_108.xp = local_108.xp + -1e-05;
          local_108.yp = local_108.yp + 0.0;
          local_108.w = local_108.w + 2e-05;
          local_108.h = local_108.h + 0.0;
        }
        if ((local_108.h == 0.0) && (!NAN(local_108.h))) {
          local_108.xp = local_108.xp + 0.0;
          local_108.yp = local_108.yp + -1e-05;
          local_108.h = local_108.h + 2e-05;
        }
        if (((uVar17 & 0x2000040000) == 0 & bVar10) != 0) {
LAB_005fe494:
          qVar30 = QGraphicsItem::boundingRegionGranularity(item);
          uVar28 = -(ulong)(qVar30 < -qVar30);
          if ((double)(~uVar28 & (ulong)qVar30 | (ulong)-qVar30 & uVar28) <= 1e-12) {
            pQVar15 = (item->d_ptr).d;
            if ((pQVar15->field_0x167 & 0x40) == 0) {
              local_88[0].w = -NAN;
              local_88[0].h = -NAN;
              local_88[0].xp = -NAN;
              local_88[0].yp = -NAN;
              QTransform::mapRect(local_88);
              if ((0.0 < local_88[0].w) && (0.0 < local_88[0].h)) {
                QGraphicsScene::update(this_00,local_88);
              }
            }
            else {
              local_88[0].xp = (pQVar15->sceneTransform).m_matrix[2][0] + local_108.xp;
              local_88[0].yp = (pQVar15->sceneTransform).m_matrix[2][1] + local_108.yp;
              local_88[0].w = local_108.w;
              local_88[0].h = local_108.h;
              QGraphicsScene::update(this_00,local_88);
            }
            goto LAB_005feb40;
          }
        }
      }
      local_128.w = 0.0;
      local_128.h = 0.0;
      local_128.xp = 0.0;
      local_128.yp = 0.0;
      lVar18 = (this->views).d.size;
      if (lVar18 != 0) {
        ppQVar4 = (this->views).d.ptr;
        bVar25 = true;
        lVar24 = 0;
        do {
          this_01 = *(QGraphicsViewPrivate **)(*(long *)((long)ppQVar4 + lVar24) + 8);
          QHash<QWidget*,QRect>::tryEmplace_impl<QWidget*const&>
                    ((TryEmplaceResult *)local_88,
                     (QHash<QWidget*,QRect> *)&((item->d_ptr).d)->paintedViewBoundingRects,
                     &(this_01->super_QAbstractScrollAreaPrivate).viewport);
          lVar19 = ((ulong)local_88[0].yp >> 7) * 0x90;
          lVar16 = *(long *)(*(long *)((long)local_88[0].xp + 0x20) + 0x80 + lVar19);
          uVar28 = (ulong)*(byte *)((ulong)(SUB84(local_88[0].yp,0) & 0x7f) +
                                   *(long *)((long)local_88[0].xp + 0x20) + lVar19);
          lVar19 = lVar16 + uVar28 * 0x18;
          r_00 = (QRect *)(lVar19 + 8);
          if (((this_01->field_0x301 & 0x10) == 0) &&
             (this_01->viewportUpdateMode != NoViewportUpdate)) {
            if ((*(ulong *)&((item->d_ptr).d)->field_0x160 & 0x10000000000000) != 0) {
              (r_00->x1).m_i = (r_00->x1).m_i + (this_01->dirtyScrollOffset).xp.m_i;
              piVar2 = (int *)(lVar16 + 0xc + uVar28 * 0x18);
              *piVar2 = *piVar2 + (this_01->dirtyScrollOffset).yp.m_i;
              piVar2 = (int *)(lVar16 + 0x10 + uVar28 * 0x18);
              *piVar2 = *piVar2 + (this_01->dirtyScrollOffset).xp.m_i;
              piVar2 = (int *)(lVar16 + 0x14 + uVar28 * 0x18);
              *piVar2 = *piVar2 + (this_01->dirtyScrollOffset).yp.m_i;
              bVar11 = QGraphicsViewPrivate::updateRect(this_01,r_00);
              if (!bVar11) {
                r_00->x1 = -1;
                r_00->y1 = -1;
                *(undefined8 *)(lVar19 + 0x10) = 0xfffffffdfffffffd;
              }
            }
            pQVar15 = (item->d_ptr).d;
            uVar12 = (uint)*(ulong *)&pQVar15->field_0x160;
            if (((uVar12 >> 0x19 & 1) != 0) &&
               (((((*(ulong *)&pQVar15->field_0x160 & 0x10000000000000) != 0 ||
                  ((r_00->x1).m_i != -1)) || (*(int *)(lVar16 + 0xc + uVar28 * 0x18) != -1)) ||
                ((*(int *)(lVar16 + 0x10 + uVar28 * 0x18) != -3 ||
                 (*(int *)(lVar16 + 0x14 + uVar28 * 0x18) != -3)))))) {
              if (bVar25) {
                local_128.w = local_108.w;
                local_128.h = local_108.h;
                local_128.xp = local_108.xp;
                local_128.yp = local_108.yp;
                if (-1 < (int)uVar12) {
                  dVar29 = (pQVar15->needsRepaint).w;
                  if ((dVar29 != 0.0) || (NAN(dVar29))) {
                    qVar30 = (pQVar15->needsRepaint).h;
                  }
                  else {
                    (pQVar15->needsRepaint).xp = (pQVar15->needsRepaint).xp + -1e-05;
                    (pQVar15->needsRepaint).yp = (pQVar15->needsRepaint).yp + 0.0;
                    dVar29 = dVar29 + 2e-05;
                    qVar30 = (pQVar15->needsRepaint).h + 0.0;
                    (pQVar15->needsRepaint).w = dVar29;
                    (pQVar15->needsRepaint).h = qVar30;
                  }
                  if ((qVar30 == 0.0) && (!NAN(qVar30))) {
                    (pQVar15->needsRepaint).xp = (pQVar15->needsRepaint).xp + 0.0;
                    (pQVar15->needsRepaint).yp = (pQVar15->needsRepaint).yp + -1e-05;
                    (pQVar15->needsRepaint).w = dVar29;
                    (pQVar15->needsRepaint).h = qVar30 + 2e-05;
                  }
                  QRectF::operator&(local_88,&local_128);
                  local_128.w = local_88[0].w;
                  local_128.h = local_88[0].h;
                  local_128.xp = local_88[0].xp;
                  local_128.yp = local_88[0].yp;
                }
              }
              bVar25 = false;
              if ((0.0 < local_128.w) && (0.0 < local_128.h)) {
                pQVar15 = (item->d_ptr).d;
                this_02 = *(QGraphicsView **)
                           &(this_01->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                            super_QWidgetPrivate.field_0x8;
                if ((uVar17 & 0x2000040000) == 0) {
                  if (((pQVar15->field_0x167 & 0x40) == 0) || ((this_01->field_0x300 & 0x10) == 0))
                  {
                    bVar25 = QGraphicsView::isTransformed(this_02);
                    if (bVar25) {
                      pQVar22 = &pQVar15->sceneTransform;
                      pQVar20 = local_88;
                      for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
                        pQVar20->xp = pQVar22->m_matrix[0][0];
                        pQVar22 = (QTransform *)((long)pQVar22 + (ulong)bVar27 * -0x10 + 8);
                        pQVar20 = (QRectF *)((long)pQVar20 + (ulong)bVar27 * -0x10 + 8);
                      }
                      QGraphicsView::viewportTransform(&local_d8,this_02);
                      QTransform::operator*=((QTransform *)local_88,&local_d8);
                      goto LAB_005fe81d;
                    }
                    if ((pQVar15->field_0x162 & 0x80) == 0) {
                      QTransform::mapRect(local_88);
                      if ((0.0 < local_88[0].w) && (0.0 < local_88[0].h)) {
                        bVar10 = (byte)(this_01->optimizationFlags).
                                       super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>
                                       .super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i;
                        goto joined_r0x005fe966;
                      }
                      goto LAB_005feb04;
                    }
                    pQVar20 = (QRectF *)&pQVar15->sceneTransform;
                    goto LAB_005fe8aa;
                  }
                  local_88[0].w = local_128.w;
                  local_88[0].h = local_128.h;
                  local_88[0].xp = local_128.xp;
                  local_88[0].yp = local_128.yp;
                  dVar29 = (pQVar15->sceneTransform).m_matrix[2][0];
                  dVar9 = (pQVar15->sceneTransform).m_matrix[2][1];
                  qVar13 = QGraphicsViewPrivate::horizontalScroll(this_01);
                  qVar14 = QGraphicsViewPrivate::verticalScroll(this_01);
                  local_88[0].xp = (dVar29 - (double)qVar13) + local_88[0].xp;
                  local_88[0].yp = (dVar9 - (double)qVar14) + local_88[0].yp;
                  if ((0.0 < local_88[0].w) && (0.0 < local_88[0].h)) {
                    bVar10 = (byte)(this_01->optimizationFlags).
                                   super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>.
                                   super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i;
joined_r0x005fe966:
                    if ((bVar10 & 2) == 0) {
                      auVar33 = QRectF::toAlignedRect();
                      auVar34._12_4_ = auVar33._12_4_;
                      auVar34._0_4_ = (undefined4)(auVar33._0_8_ + 0xfffffffe);
                      auVar34._8_4_ = (undefined4)(auVar33._8_8_ + 2);
                      auVar34._4_4_ = auVar34._8_4_;
                      local_d8.m_matrix[0][0] =
                           (qreal)(CONCAT44(auVar33._4_4_,auVar34._0_4_) + -0x200000000);
                      local_d8.m_matrix[0][1] = (qreal)(auVar34._8_8_ + 0x200000000);
                    }
                    else {
                      auVar34 = QRectF::toAlignedRect();
                      auVar33._12_4_ = auVar34._12_4_;
                      auVar33._0_4_ = (undefined4)(auVar34._0_8_ + 0xffffffff);
                      auVar33._8_4_ = (undefined4)(auVar34._8_8_ + 1);
                      auVar33._4_4_ = auVar33._8_4_;
                      local_d8.m_matrix[0][0] =
                           (qreal)(CONCAT44(auVar34._4_4_,auVar33._0_4_) + -0x100000000);
                      local_d8.m_matrix[0][1] = (qreal)(auVar33._8_8_ + 0x100000000);
                    }
                    r = (QRect *)&local_d8;
                    goto LAB_005feaee;
                  }
                }
                else {
                  pQVar7 = pQVar15->q_ptr;
                  pqVar21 = (qreal *)&DAT_006f3c60;
                  pQVar20 = local_88;
                  for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
                    pQVar20->xp = *pqVar21;
                    pqVar21 = pqVar21 + (ulong)bVar27 * -2 + 1;
                    pQVar20 = (QRectF *)((long)pQVar20 + (ulong)bVar27 * -0x10 + 8);
                  }
                  QGraphicsView::viewportTransform(&local_d8,this_02);
                  QGraphicsItem::deviceTransform((QTransform *)local_88,pQVar7,&local_d8);
LAB_005fe81d:
                  pQVar20 = local_88;
                  if ((pQVar15->field_0x162 & 0x80) == 0) {
                    QTransform::mapRect((QRectF *)&local_d8);
                    if ((local_d8.m_matrix[0][2] <= 0.0) || (local_d8.m_matrix[1][0] <= 0.0))
                    goto LAB_005feb04;
                    if (((this_01->optimizationFlags).
                         super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>.
                         super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i & 2) == 0) {
                      auVar33 = QRectF::toAlignedRect();
                      auVar31._12_4_ = auVar33._12_4_;
                      auVar31._0_4_ = (undefined4)(auVar33._0_8_ + 0xfffffffe);
                      auVar31._8_4_ = (undefined4)(auVar33._8_8_ + 2);
                      auVar31._4_4_ = auVar31._8_4_;
                      local_e8._0_8_ = CONCAT44(auVar33._4_4_,auVar31._0_4_) + -0x200000000;
                      local_e8._8_8_ = auVar31._8_8_ + 0x200000000;
                    }
                    else {
                      auVar33 = QRectF::toAlignedRect();
                      auVar32._12_4_ = auVar33._12_4_;
                      auVar32._0_4_ = (undefined4)(auVar33._0_8_ + 0xffffffff);
                      auVar32._8_4_ = (undefined4)(auVar33._8_8_ + 1);
                      auVar32._4_4_ = auVar32._8_4_;
                      local_e8._0_8_ = CONCAT44(auVar33._4_4_,auVar32._0_4_) + -0x100000000;
                      local_e8._8_8_ = auVar32._8_8_ + 0x100000000;
                    }
                    r = &local_e8;
LAB_005feaee:
                    bVar25 = QGraphicsViewPrivate::updateRect(this_01,r);
                  }
                  else {
LAB_005fe8aa:
                    bVar25 = QGraphicsViewPrivate::updateRegion
                                       (this_01,&local_128,(QTransform *)pQVar20);
                  }
                  if (bVar25 != false) {
                    bVar25 = false;
                    goto LAB_005fe5da;
                  }
                }
LAB_005feb04:
                bVar25 = false;
                if ((*(ulong *)&((item->d_ptr).d)->field_0x160 & 0x10000000000000) != 0)
                goto LAB_005fe5cc;
              }
            }
          }
          else {
LAB_005fe5cc:
            r_00->x1 = -1;
            r_00->y1 = -1;
            *(undefined8 *)(lVar19 + 0x10) = 0xfffffffdfffffffd;
          }
LAB_005fe5da:
          lVar24 = lVar24 + 8;
        } while (lVar18 << 3 != lVar24);
      }
    }
LAB_005feb40:
    if (lVar3 == 0) {
LAB_005feb59:
      if (((uVar17 & 0x20000000000000) != 0) &&
         (pQVar15 = (item->d_ptr).d, (pQVar15->children).d.size != 0)) {
        uVar17 = 0;
        do {
          puVar1 = &(((pQVar15->children).d.ptr[uVar17]->d_ptr).d)->field_0x160;
          *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
          uVar17 = uVar17 + 1;
        } while (uVar17 < (ulong)(pQVar15->children).d.size);
      }
    }
    else {
      pQVar15 = (item->d_ptr).d;
      uVar28 = *(ulong *)&pQVar15->field_0x160;
      if (((uint)uVar28 >> 0x1a & 1) == 0) goto LAB_005feb59;
      if ((((uVar28 & 0x8001000000000) != 0) && (bVar26 || (local_168 & 0x10000000000000) == 0)) &&
         (lVar3 = (this->views).d.size, lVar3 != 0)) {
        ppQVar4 = (this->views).d.ptr;
        lVar18 = 0;
        do {
          QGraphicsViewPrivate::setUpdateClip
                    (*(QGraphicsViewPrivate **)(*(long *)((long)ppQVar4 + lVar18) + 8),item);
          lVar18 = lVar18 + 8;
        } while (lVar3 << 3 != lVar18);
        pQVar15 = (item->d_ptr).d;
      }
      uVar5 = *(ulong *)&pQVar15->field_0x160;
      lVar3 = (pQVar15->children).d.size;
      if (lVar3 != 0) {
        ppQVar6 = (pQVar15->children).d.ptr;
        lVar18 = 0;
        do {
          pQVar7 = *(QGraphicsItem **)((long)ppQVar6 + lVar18);
          if ((uVar17 & 0x20000000000000) != 0) {
            puVar1 = &((pQVar7->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
          }
          if ((local_168 & 0x10000000000000) != 0) {
            puVar1 = &((pQVar7->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x10000000000000;
          }
          if ((uVar5 & 0x200000000000000) != 0) {
            puVar1 = &((pQVar7->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x200000000000000;
          }
          if ((uVar5 & 0x400000000000000) != 0) {
            puVar1 = &((pQVar7->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x400000000000000;
          }
          if (((uint)uVar5 >> 0x1e & 1) != 0) {
            puVar1 = &((pQVar7->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x2000000;
            puVar1 = &((pQVar7->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x80000000;
            puVar1 = &((pQVar7->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x4000000;
            puVar1 = &((pQVar7->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x40000000;
          }
          processDirtyItemsRecursive
                    (this,pQVar7,
                     dirtyAncestorContainsChildren ||
                     (int)(uint)uVar5 < 0 && (uVar28 & 0x8001000000000) != 0,parentOpacity_00);
          lVar18 = lVar18 + 8;
        } while (lVar3 << 3 != lVar18);
      }
      if (((uVar28 & 0x8001000000000) != 0) && (lVar3 = (this->views).d.size, lVar3 != 0)) {
        ppQVar4 = (this->views).d.ptr;
        lVar18 = 0;
        do {
          QGraphicsViewPrivate::setUpdateClip
                    (*(QGraphicsViewPrivate **)(*(long *)((long)ppQVar4 + lVar18) + 8),
                     (QGraphicsItem *)0x0);
          lVar18 = lVar18 + 8;
        } while (lVar3 << 3 != lVar18);
      }
    }
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfffffffffdffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffefffffffffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffbfffffffffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfffffffffbffffff;
    pQVar15 = (item->d_ptr).d;
    (pQVar15->needsRepaint).w = 0.0;
    (pQVar15->needsRepaint).h = 0.0;
    (pQVar15->needsRepaint).xp = 0.0;
    (pQVar15->needsRepaint).yp = 0.0;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffffbfffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffff7fffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfdffffffffffffff;
    puVar1 = &((item->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfbffffffffffffff;
    pQVar15 = (item->d_ptr).d;
    if ((long)*(ulong *)&pQVar15->field_0x160 < 0) {
      *(ulong *)&pQVar15->field_0x160 = *(ulong *)&pQVar15->field_0x160 & 0x7fffffffffffffff;
      pQVar15 = (item->d_ptr).d;
      uVar12 = *(uint *)&pQVar15->field_0x168;
      uVar23 = 4;
      if ((uVar12 & 1) != 0) {
        uVar23 = 0xc;
        goto LAB_005fee99;
      }
    }
    else {
      uVar12 = *(uint *)&pQVar15->field_0x168;
      if ((uVar12 & 1) == 0) goto LAB_005feeb4;
      uVar23 = 8;
LAB_005fee99:
      *(uint *)&pQVar15->field_0x168 = uVar12 & 0xfffffffe;
      pQVar15 = (item->d_ptr).d;
    }
    pQVar8 = pQVar15->graphicsEffect;
    if (pQVar8 != (QGraphicsEffect *)0x0) {
      (**(code **)(*(long *)pQVar8 + 0x70))(pQVar8,uVar23);
    }
  }
LAB_005feeb4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005fef87:
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::processDirtyItemsRecursive(QGraphicsItem *item, bool dirtyAncestorContainsChildren,
                                                       qreal parentOpacity)
{
    Q_Q(QGraphicsScene);
    Q_ASSERT(item);
    Q_ASSERT(!updateAll);

    if (!item->d_ptr->dirty && !item->d_ptr->dirtyChildren) {
        resetDirtyItem(item);
        return;
    }

    const bool itemIsHidden = !item->d_ptr->ignoreVisible && !item->d_ptr->visible;
    if (itemIsHidden) {
        resetDirtyItem(item, /*recursive=*/true);
        return;
    }

    bool itemHasContents = !(item->d_ptr->flags & QGraphicsItem::ItemHasNoContents);
    const bool itemHasChildren = !item->d_ptr->children.isEmpty();
    if (!itemHasContents) {
        if (!itemHasChildren) {
            resetDirtyItem(item);
            return; // Item has neither contents nor children!(?)
        }
        if (item->d_ptr->graphicsEffect)
            itemHasContents = true;
    }

    const qreal opacity = item->d_ptr->combineOpacityFromParent(parentOpacity);
    const bool itemIsFullyTransparent = !item->d_ptr->ignoreOpacity
                                        && QGraphicsItemPrivate::isOpacityNull(opacity);
    if (itemIsFullyTransparent && (!itemHasChildren || item->d_ptr->childrenCombineOpacity())) {
        resetDirtyItem(item, /*recursive=*/itemHasChildren);
        return;
    }

    bool wasDirtyParentSceneTransform = item->d_ptr->dirtySceneTransform;
    const bool itemIsUntransformable = item->d_ptr->itemIsUntransformable();
    if (wasDirtyParentSceneTransform && !itemIsUntransformable) {
        item->d_ptr->updateSceneTransformFromParent();
        Q_ASSERT(!item->d_ptr->dirtySceneTransform);
    }

    const bool wasDirtyParentViewBoundingRects = item->d_ptr->paintedViewBoundingRectsNeedRepaint;
    if (itemIsFullyTransparent || !itemHasContents || dirtyAncestorContainsChildren) {
        // Make sure we don't process invisible items or items with no content.
        item->d_ptr->dirty = 0;
        item->d_ptr->fullUpdatePending = 0;
        // Might have a dirty view bounding rect otherwise.
        if (itemIsFullyTransparent || !itemHasContents)
            item->d_ptr->paintedViewBoundingRectsNeedRepaint = 0;
    }

    if (!hasSceneRect && item->d_ptr->geometryChanged && item->d_ptr->visible) {
        // Update growingItemsBoundingRect.
        if (item->d_ptr->sceneTransformTranslateOnly) {
            growingItemsBoundingRect |= item->boundingRect().translated(item->d_ptr->sceneTransform.dx(),
                                                                        item->d_ptr->sceneTransform.dy());
        } else {
            growingItemsBoundingRect |= item->d_ptr->sceneTransform.mapRect(item->boundingRect());
        }
    }

    // Process item.
    if (item->d_ptr->dirty || item->d_ptr->paintedViewBoundingRectsNeedRepaint) {
        const bool useCompatUpdate = views.isEmpty() || isSignalConnected(changedSignalIndex);
        const QRectF itemBoundingRect = adjustedItemEffectiveBoundingRect(item);

        if (useCompatUpdate && !itemIsUntransformable && qFuzzyIsNull(item->boundingRegionGranularity())) {
            // This block of code is kept for compatibility. Since 4.5, by default
            // QGraphicsView does not connect the signal and we use the below
            // method of delivering updates.
            if (item->d_ptr->sceneTransformTranslateOnly) {
                q->update(itemBoundingRect.translated(item->d_ptr->sceneTransform.dx(),
                                                      item->d_ptr->sceneTransform.dy()));
            } else {
                QRectF rect = item->d_ptr->sceneTransform.mapRect(itemBoundingRect);
                if (!rect.isEmpty())
                    q->update(rect);
            }
        } else {
            QRectF dirtyRect;
            bool uninitializedDirtyRect = true;

            for (auto view : std::as_const(views)) {
                QGraphicsViewPrivate *viewPrivate = view->d_func();
                QRect &paintedViewBoundingRect = item->d_ptr->paintedViewBoundingRects[viewPrivate->viewport];
                if (viewPrivate->fullUpdatePending
                    || viewPrivate->viewportUpdateMode == QGraphicsView::NoViewportUpdate) {
                    // Okay, if we have a full update pending or no viewport update, this item's
                    // paintedViewBoundingRect  will be updated correctly in the next paintEvent if
                    // it is inside the viewport, but for now we can pretend that it is outside.
                    paintedViewBoundingRect = QRect(-1, -1, -1, -1);
                    continue;
                }

                if (item->d_ptr->paintedViewBoundingRectsNeedRepaint) {
                    paintedViewBoundingRect.translate(viewPrivate->dirtyScrollOffset);
                    if (!viewPrivate->updateRect(paintedViewBoundingRect))
                        paintedViewBoundingRect = QRect(-1, -1, -1, -1); // Outside viewport.
                }

                if (!item->d_ptr->dirty)
                    continue;

                if (!item->d_ptr->paintedViewBoundingRectsNeedRepaint
                    && paintedViewBoundingRect.x() == -1 && paintedViewBoundingRect.y() == -1
                    && paintedViewBoundingRect.width() == -1 && paintedViewBoundingRect.height() == -1) {
                    continue; // Outside viewport.
                }

                if (uninitializedDirtyRect) {
                    dirtyRect = itemBoundingRect;
                    if (!item->d_ptr->fullUpdatePending) {
                        _q_adjustRect(&item->d_ptr->needsRepaint);
                        dirtyRect &= item->d_ptr->needsRepaint;
                    }
                    uninitializedDirtyRect = false;
                }

                if (dirtyRect.isEmpty())
                    continue; // Discard updates outside the bounding rect.

                if (!updateHelper(viewPrivate, item->d_ptr.data(), dirtyRect, itemIsUntransformable)
                    && item->d_ptr->paintedViewBoundingRectsNeedRepaint) {
                    paintedViewBoundingRect = QRect(-1, -1, -1, -1); // Outside viewport.
                }
            }
        }
    }

    // Process children.
    if (itemHasChildren && item->d_ptr->dirtyChildren) {
        const bool itemClipsChildrenToShape = item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                                              || item->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape;
        // Items with no content are threated as 'dummy' items which means they are never drawn and
        // 'processed', so the painted view bounding rect is never up-to-date. This means that whenever
        // such an item changes geometry, its children have to take care of the update regardless
        // of whether the item clips children to shape or not.
        const bool bypassUpdateClip = !itemHasContents && wasDirtyParentViewBoundingRects;
        if (itemClipsChildrenToShape && !bypassUpdateClip) {
            // Make sure child updates are clipped to the item's bounding rect.
            for (auto view : std::as_const(views))
                view->d_func()->setUpdateClip(item);
        }
        if (!dirtyAncestorContainsChildren) {
            dirtyAncestorContainsChildren = item->d_ptr->fullUpdatePending
                                            && itemClipsChildrenToShape;
        }
        const bool allChildrenDirty = item->d_ptr->allChildrenDirty;
        const bool parentIgnoresVisible = item->d_ptr->ignoreVisible;
        const bool parentIgnoresOpacity = item->d_ptr->ignoreOpacity;
        for (auto child : std::as_const(item->d_ptr->children)) {
            if (wasDirtyParentSceneTransform)
                child->d_ptr->dirtySceneTransform = 1;
            if (wasDirtyParentViewBoundingRects)
                child->d_ptr->paintedViewBoundingRectsNeedRepaint = 1;
            if (parentIgnoresVisible)
                child->d_ptr->ignoreVisible = 1;
            if (parentIgnoresOpacity)
                child->d_ptr->ignoreOpacity = 1;
            if (allChildrenDirty) {
                child->d_ptr->dirty = 1;
                child->d_ptr->fullUpdatePending = 1;
                child->d_ptr->dirtyChildren = 1;
                child->d_ptr->allChildrenDirty = 1;
            }
            processDirtyItemsRecursive(child, dirtyAncestorContainsChildren, opacity);
        }

        if (itemClipsChildrenToShape) {
            // Reset updateClip.
            for (auto view : std::as_const(views))
                view->d_func()->setUpdateClip(nullptr);
        }
    } else if (wasDirtyParentSceneTransform) {
        item->d_ptr->invalidateChildrenSceneTransform();
    }

    resetDirtyItem(item);
}